

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

tuple<Move,_unsigned_long,_unsigned_long> * __thiscall
Controller::makeMove
          (tuple<Move,_unsigned_long,_unsigned_long> *__return_storage_ptr__,Controller *this,
          uint tilePosition)

{
  pointer this_00;
  pointer this_01;
  int local_34 [4];
  uint local_24;
  Move move;
  uint col;
  uint row;
  uint tilePosition_local;
  Controller *this_local;
  
  move = tilePosition / 10;
  local_24 = tilePosition % 10;
  col = tilePosition;
  _row = this;
  this_local = (Controller *)__return_storage_ptr__;
  this_00 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
  local_34[3] = Board::checkMove(this_00,(ulong)move,(ulong)local_24);
  if (local_34[3] == NOT_ALLOWED) {
    local_34[2] = 4;
    local_34[1] = 0;
    local_34[0] = 0;
    std::tuple<Move,_unsigned_long,_unsigned_long>::tuple<Move,_int,_int,_true,_true>
              (__return_storage_ptr__,(Move *)(local_34 + 2),local_34 + 1,local_34);
  }
  else {
    this_01 = std::unique_ptr<UndoMove,_std::default_delete<UndoMove>_>::operator->
                        (&this->undoMoveService);
    UndoMove::PutMove(this_01,local_34[3],(ulong)move,(ulong)local_24);
    std::tuple<Move,_unsigned_long,_unsigned_long>::
    tuple<Move_&,_unsigned_int_&,_unsigned_int_&,_true,_true>
              (__return_storage_ptr__,(Move *)(local_34 + 3),&move,&local_24);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<Move, size_t, size_t> Controller::makeMove( uint tilePosition )
{
    uint row = tilePosition / 10;
    uint col = tilePosition % 10;
    Move move = board->checkMove( row, col );
    if ( move == Move::NOT_ALLOWED )
    {
        return { Move::NOT_ALLOWED, 0, 0 };
    }

    undoMoveService->PutMove( move, row, col );
    return { move, row, col };
}